

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fImplementationLimitTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::ImplementationLimitTests::init
          (ImplementationLimitTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  LimitQueryCase<long> *pLVar2;
  LimitQueryCase<int> *pLVar3;
  LimitQueryCase<float> *this_00;
  LimitQueryCase<deqp::gles3::Functional::LimitQuery::FloatRange> *pLVar4;
  TestNode *pTVar5;
  LimitQueryCase<deqp::gles3::Functional::LimitQuery::Boolean> *this_01;
  LimitQueryCase<unsigned_long> *this_02;
  LimitQueryCase<deqp::gles3::Functional::LimitQuery::NegInt> *this_03;
  LimitQueryCase<deqp::gles3::Functional::LimitQuery::AlignmentInt> *this_04;
  int local_108 [6];
  long local_f0 [2];
  int local_e0;
  AlignmentInt local_dc;
  long local_d8;
  int local_cc [2];
  NegInt local_c4;
  int local_c0 [10];
  unsigned_long local_98;
  Boolean local_8d;
  int local_8c [5];
  FloatRange local_78;
  FloatRange local_70;
  int local_68 [4];
  float local_58;
  int local_54 [7];
  long local_38;
  undefined4 local_2c;
  undefined4 local_28;
  int minCombinedFragmentUniformComponents;
  int minCombinedVertexUniformComponents;
  int minUniformBlockSize;
  int minFragmentUniformComponents;
  int minFragmentUniformBlocks;
  int minVertexUniformComponents;
  int minVertexUniformBlocks;
  ImplementationLimitTests *this_local;
  
  minFragmentUniformBlocks = 0xc;
  minFragmentUniformComponents = 0x400;
  minUniformBlockSize = 0xc;
  minCombinedVertexUniformComponents = 0x380;
  minCombinedFragmentUniformComponents = 0x4000;
  local_28 = 0xc400;
  local_2c = 0xc380;
  _minVertexUniformComponents = this;
  pLVar2 = (LimitQueryCase<long> *)operator_new(0x88);
  local_38 = 0xffffff;
  LimitQueryCase<long>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_element_index","GL_MAX_ELEMENT_INDEX"
             ,0x8d6b,&local_38);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_54[3] = 4;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"subpixel_bits","GL_SUBPIXEL_BITS",0xd50,
             local_54 + 3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_54[2] = 0x100;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_3d_texture_size",
             "GL_MAX_3D_TEXTURE_SIZE",0x8073,local_54 + 2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_54[1] = 0x800;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_texture_size","GL_MAX_TEXTURE_SIZE",
             0xd33,local_54 + 1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_54[0] = 0x100;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_array_texture_layers",
             "GL_MAX_ARRAY_TEXTURE_LAYERS",0x88ff,local_54);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  this_00 = (LimitQueryCase<float> *)operator_new(0x80);
  local_58 = 2.0;
  LimitQueryCase<float>::LimitQueryCase
            (this_00,(this->super_TestCaseGroup).m_context,"max_texture_lod_bias",
             "GL_MAX_TEXTURE_LOD_BIAS",0x84fd,&local_58);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_68[3] = 0x800;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_cube_map_texture_size",
             "GL_MAX_CUBE_MAP_TEXTURE_SIZE",0x851c,local_68 + 3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_68[2] = 0x800;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_renderbuffer_size",
             "GL_MAX_RENDERBUFFER_SIZE",0x84e8,local_68 + 2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_68[1] = 4;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_draw_buffers","GL_MAX_DRAW_BUFFERS",
             0x8824,local_68 + 1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_68[0] = 4;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_color_attachments",
             "GL_MAX_COLOR_ATTACHMENTS",0x8cdf,local_68);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar4 = (LimitQueryCase<deqp::gles3::Functional::LimitQuery::FloatRange> *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  LimitQuery::FloatRange::FloatRange(&local_70,1.0,1.0);
  LimitQueryCase<deqp::gles3::Functional::LimitQuery::FloatRange>::LimitQueryCase
            (pLVar4,pCVar1,"aliased_point_size_range","GL_ALIASED_POINT_SIZE_RANGE",0x846d,&local_70
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase<deqp::gles3::Functional::LimitQuery::FloatRange> *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  LimitQuery::FloatRange::FloatRange(&local_78,1.0,1.0);
  LimitQueryCase<deqp::gles3::Functional::LimitQuery::FloatRange>::LimitQueryCase
            (pLVar4,pCVar1,"aliased_line_width_range","GL_ALIASED_LINE_WIDTH_RANGE",0x846e,&local_78
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar4);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_8c[4] = 0;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_elements_indices",
             "GL_MAX_ELEMENTS_INDICES",0x80e9,local_8c + 4);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_8c[3] = 0;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_elements_vertices",
             "GL_MAX_ELEMENTS_VERTICES",33000,local_8c + 3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_8c[2] = 10;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"num_compressed_texture_formats",
             "GL_NUM_COMPRESSED_TEXTURE_FORMATS",0x86a2,local_8c + 2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pTVar5 = (TestNode *)operator_new(0x78);
  CompressedTextureFormatsQueryCase::CompressedTextureFormatsQueryCase
            ((CompressedTextureFormatsQueryCase *)pTVar5,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_8c[1] = 0;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"num_program_binary_formats",
             "GL_NUM_PROGRAM_BINARY_FORMATS",0x87fe,local_8c + 1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_8c[0] = 0;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"num_shader_binary_formats",
             "GL_NUM_SHADER_BINARY_FORMATS",0x8df9,local_8c);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  this_01 = (LimitQueryCase<deqp::gles3::Functional::LimitQuery::Boolean> *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  LimitQuery::Boolean::Boolean(&local_8d,'\x01');
  LimitQueryCase<deqp::gles3::Functional::LimitQuery::Boolean>::LimitQueryCase
            (this_01,pCVar1,"shader_compiler","GL_SHADER_COMPILER",0x8dfa,&local_8d);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (LimitQueryCase<unsigned_long> *)operator_new(0x88);
  local_98 = 0;
  LimitQueryCase<unsigned_long>::LimitQueryCase
            (this_02,(this->super_TestCaseGroup).m_context,"max_server_wait_timeout",
             "GL_MAX_SERVER_WAIT_TIMEOUT",0x9111,&local_98);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  pTVar5 = (TestNode *)operator_new(0x78);
  ExtensionQueryCase::ExtensionQueryCase
            ((ExtensionQueryCase *)pTVar5,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_c0[9] = 0;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"num_extensions","GL_NUM_EXTENSIONS",
             0x821d,local_c0 + 9);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_c0[8] = 3;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"major_version","GL_MAJOR_VERSION",0x821b,
             local_c0 + 8);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_c0[7] = 0;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"minor_version","GL_MINOR_VERSION",0x821c,
             local_c0 + 7);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_c0[6] = 0x10;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_vertex_attribs",
             "GL_MAX_VERTEX_ATTRIBS",0x8869,local_c0 + 6);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_vertex_uniform_components",
             "GL_MAX_VERTEX_UNIFORM_COMPONENTS",0x8b4a,&minFragmentUniformComponents);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_c0[5] = 0x100;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_vertex_uniform_vectors",
             "GL_MAX_VERTEX_UNIFORM_VECTORS",0x8dfb,local_c0 + 5);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_vertex_uniform_blocks",
             "GL_MAX_VERTEX_UNIFORM_BLOCKS",0x8a2b,&minFragmentUniformBlocks);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_c0[4] = 0x40;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_vertex_output_components",
             "GL_MAX_VERTEX_OUTPUT_COMPONENTS",0x9122,local_c0 + 4);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_c0[3] = 0x10;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_vertex_texture_image_units",
             "GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS",0x8b4c,local_c0 + 3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_fragment_uniform_components",
             "GL_MAX_FRAGMENT_UNIFORM_COMPONENTS",0x8b49,&minCombinedVertexUniformComponents);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_c0[2] = 0xe0;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_fragment_uniform_vectors",
             "GL_MAX_FRAGMENT_UNIFORM_VECTORS",0x8dfd,local_c0 + 2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_fragment_uniform_blocks",
             "GL_MAX_FRAGMENT_UNIFORM_BLOCKS",0x8a2d,&minUniformBlockSize);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_c0[1] = 0x3c;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_fragment_input_components",
             "GL_MAX_FRAGMENT_INPUT_COMPONENTS",0x9125,local_c0 + 1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_c0[0] = 0x10;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_texture_image_units",
             "GL_MAX_TEXTURE_IMAGE_UNITS",0x8872,local_c0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  this_03 = (LimitQueryCase<deqp::gles3::Functional::LimitQuery::NegInt> *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  LimitQuery::NegInt::NegInt(&local_c4,-8);
  LimitQueryCase<deqp::gles3::Functional::LimitQuery::NegInt>::LimitQueryCase
            (this_03,pCVar1,"min_program_texel_offset","GL_MIN_PROGRAM_TEXEL_OFFSET",0x8904,
             &local_c4);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_cc[1] = 7;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_program_texel_offset",
             "GL_MAX_PROGRAM_TEXEL_OFFSET",0x8905,local_cc + 1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_cc[0] = 0x18;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_uniform_buffer_bindings",
             "GL_MAX_UNIFORM_BUFFER_BINDINGS",0x8a2f,local_cc);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar2 = (LimitQueryCase<long> *)operator_new(0x88);
  local_d8 = 0x4000;
  LimitQueryCase<long>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_uniform_block_size",
             "GL_MAX_UNIFORM_BLOCK_SIZE",0x8a30,&local_d8);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  this_04 = (LimitQueryCase<deqp::gles3::Functional::LimitQuery::AlignmentInt> *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  LimitQuery::AlignmentInt::AlignmentInt(&local_dc,0x100);
  LimitQueryCase<deqp::gles3::Functional::LimitQuery::AlignmentInt>::LimitQueryCase
            (this_04,pCVar1,"uniform_buffer_offset_alignment","GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT",
             0x8a34,&local_dc);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_e0 = 0x18;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_combined_uniform_blocks",
             "GL_MAX_COMBINED_UNIFORM_BLOCKS",0x8a2e,&local_e0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar2 = (LimitQueryCase<long> *)operator_new(0x88);
  local_f0[1] = 0xc400;
  LimitQueryCase<long>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_combined_vertex_uniform_components",
             "GL_MAX_COMBINED_VERTEX_UNIFORM_COMPONENTS",0x8a31,local_f0 + 1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<long> *)operator_new(0x88);
  local_f0[0] = 0xc380;
  LimitQueryCase<long>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_combined_fragment_uniform_components"
             ,"GL_MAX_COMBINED_FRAGMENT_UNIFORM_COMPONENTS",0x8a33,local_f0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_108[5] = 0x3c;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_varying_components",
             "GL_MAX_VARYING_COMPONENTS",0x8b4b,local_108 + 5);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_108[4] = 0xf;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_varying_vectors",
             "GL_MAX_VARYING_VECTORS",0x8dfc,local_108 + 4);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_108[3] = 0x20;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_combined_texture_image_units",
             "GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS",0x8b4d,local_108 + 3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_108[2] = 0x40;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,
             "max_transform_feedback_interleaved_components",
             "GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS",0x8c8a,local_108 + 2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_108[1] = 4;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"max_transform_feedback_separate_attribs",
             "GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS",0x8c8b,local_108 + 1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<int> *)operator_new(0x80);
  local_108[0] = 4;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,
             "max_transform_feedback_separate_components",
             "GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS",0x8c80,local_108);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  return extraout_EAX;
}

Assistant:

void ImplementationLimitTests::init (void)
{
	const int	minVertexUniformBlocks					= 12;
	const int	minVertexUniformComponents				= 1024;

	const int	minFragmentUniformBlocks				= 12;
	const int	minFragmentUniformComponents			= 896;

	const int	minUniformBlockSize						= 16384;
	const int	minCombinedVertexUniformComponents		= (minVertexUniformBlocks*minUniformBlockSize)/4 + minVertexUniformComponents;
	const int	minCombinedFragmentUniformComponents	= (minFragmentUniformBlocks*minUniformBlockSize)/4 + minFragmentUniformComponents;

#define LIMIT_CASE(NAME, PARAM, TYPE, MIN_VAL)	\
	addChild(new LimitQueryCase<TYPE>(m_context, #NAME, #PARAM, PARAM, MIN_VAL))

	LIMIT_CASE(max_element_index,				GL_MAX_ELEMENT_INDEX,					GLint64,	(1<<24)-1);
	LIMIT_CASE(subpixel_bits,					GL_SUBPIXEL_BITS,						GLint,		4);
	LIMIT_CASE(max_3d_texture_size,				GL_MAX_3D_TEXTURE_SIZE,					GLint,		256);
	LIMIT_CASE(max_texture_size,				GL_MAX_TEXTURE_SIZE,					GLint,		2048);
	LIMIT_CASE(max_array_texture_layers,		GL_MAX_ARRAY_TEXTURE_LAYERS,			GLint,		256);
	LIMIT_CASE(max_texture_lod_bias,			GL_MAX_TEXTURE_LOD_BIAS,				GLfloat,	2.0f);
	LIMIT_CASE(max_cube_map_texture_size,		GL_MAX_CUBE_MAP_TEXTURE_SIZE,			GLint,		2048);
	LIMIT_CASE(max_renderbuffer_size,			GL_MAX_RENDERBUFFER_SIZE,				GLint,		2048);
	LIMIT_CASE(max_draw_buffers,				GL_MAX_DRAW_BUFFERS,					GLint,		4);
	LIMIT_CASE(max_color_attachments,			GL_MAX_COLOR_ATTACHMENTS,				GLint,		4);
	// GL_MAX_VIEWPORT_DIMS
	LIMIT_CASE(aliased_point_size_range,		GL_ALIASED_POINT_SIZE_RANGE,			FloatRange,	FloatRange(1,1));
	LIMIT_CASE(aliased_line_width_range,		GL_ALIASED_LINE_WIDTH_RANGE,			FloatRange,	FloatRange(1,1));
	LIMIT_CASE(max_elements_indices,			GL_MAX_ELEMENTS_INDICES,				GLint,		0);
	LIMIT_CASE(max_elements_vertices,			GL_MAX_ELEMENTS_VERTICES,				GLint,		0);
	LIMIT_CASE(num_compressed_texture_formats,	GL_NUM_COMPRESSED_TEXTURE_FORMATS,		GLint,		DE_LENGTH_OF_ARRAY(s_requiredCompressedTexFormats));
	addChild(new CompressedTextureFormatsQueryCase(m_context)); // GL_COMPRESSED_TEXTURE_FORMATS
	// GL_PROGRAM_BINARY_FORMATS
	LIMIT_CASE(num_program_binary_formats,		GL_NUM_PROGRAM_BINARY_FORMATS,			GLint,		0);
	// GL_SHADER_BINARY_FORMATS
	LIMIT_CASE(num_shader_binary_formats,		GL_NUM_SHADER_BINARY_FORMATS,			GLint,		0);
	LIMIT_CASE(shader_compiler,					GL_SHADER_COMPILER,						Boolean,	GL_TRUE);
	// Shader data type ranges & precisions
	LIMIT_CASE(max_server_wait_timeout,			GL_MAX_SERVER_WAIT_TIMEOUT,				GLuint64,	0);

	// Version and extension support
	addChild(new ExtensionQueryCase(m_context)); // GL_EXTENSIONS + consistency validation
	LIMIT_CASE(num_extensions,					GL_NUM_EXTENSIONS,						GLint,		0);
	LIMIT_CASE(major_version,					GL_MAJOR_VERSION,						GLint,		3);
	LIMIT_CASE(minor_version,					GL_MINOR_VERSION,						GLint,		0);
	// GL_RENDERER
	// GL_SHADING_LANGUAGE_VERSION
	// GL_VENDOR
	// GL_VERSION

	// Vertex shader limits
	LIMIT_CASE(max_vertex_attribs,				GL_MAX_VERTEX_ATTRIBS,					GLint,		16);
	LIMIT_CASE(max_vertex_uniform_components,	GL_MAX_VERTEX_UNIFORM_COMPONENTS,		GLint,		minVertexUniformComponents);
	LIMIT_CASE(max_vertex_uniform_vectors,		GL_MAX_VERTEX_UNIFORM_VECTORS,			GLint,		minVertexUniformComponents/4);
	LIMIT_CASE(max_vertex_uniform_blocks,		GL_MAX_VERTEX_UNIFORM_BLOCKS,			GLint,		minVertexUniformBlocks);
	LIMIT_CASE(max_vertex_output_components,	GL_MAX_VERTEX_OUTPUT_COMPONENTS,		GLint,		64);
	LIMIT_CASE(max_vertex_texture_image_units,	GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS,		GLint,		16);

	// Fragment shader limits
	LIMIT_CASE(max_fragment_uniform_components,	GL_MAX_FRAGMENT_UNIFORM_COMPONENTS,		GLint,		minFragmentUniformComponents);
	LIMIT_CASE(max_fragment_uniform_vectors,	GL_MAX_FRAGMENT_UNIFORM_VECTORS,		GLint,		minFragmentUniformComponents/4);
	LIMIT_CASE(max_fragment_uniform_blocks,		GL_MAX_FRAGMENT_UNIFORM_BLOCKS,			GLint,		minFragmentUniformBlocks);
	LIMIT_CASE(max_fragment_input_components,	GL_MAX_FRAGMENT_INPUT_COMPONENTS,		GLint,		60);
	LIMIT_CASE(max_texture_image_units,			GL_MAX_TEXTURE_IMAGE_UNITS,				GLint,		16);
	LIMIT_CASE(min_program_texel_offset,		GL_MIN_PROGRAM_TEXEL_OFFSET,			NegInt,		-8);
	LIMIT_CASE(max_program_texel_offset,		GL_MAX_PROGRAM_TEXEL_OFFSET,			GLint,		7);

	// Aggregate shader limits
	LIMIT_CASE(max_uniform_buffer_bindings,						GL_MAX_UNIFORM_BUFFER_BINDINGS,						GLint,				24);
	LIMIT_CASE(max_uniform_block_size,							GL_MAX_UNIFORM_BLOCK_SIZE,							GLint64,			minUniformBlockSize);
	LIMIT_CASE(uniform_buffer_offset_alignment,					GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT,					AlignmentInt,		256);
	LIMIT_CASE(max_combined_uniform_blocks,						GL_MAX_COMBINED_UNIFORM_BLOCKS,						GLint,				24);
	LIMIT_CASE(max_combined_vertex_uniform_components,			GL_MAX_COMBINED_VERTEX_UNIFORM_COMPONENTS,			GLint64,			minCombinedVertexUniformComponents);
	LIMIT_CASE(max_combined_fragment_uniform_components,		GL_MAX_COMBINED_FRAGMENT_UNIFORM_COMPONENTS,		GLint64,			minCombinedFragmentUniformComponents);
	LIMIT_CASE(max_varying_components,							GL_MAX_VARYING_COMPONENTS,							GLint,				60);
	LIMIT_CASE(max_varying_vectors,								GL_MAX_VARYING_VECTORS,								GLint,				15);
	LIMIT_CASE(max_combined_texture_image_units,				GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS,				GLint,				32);

	// Transform feedback limits
	LIMIT_CASE(max_transform_feedback_interleaved_components,	GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS,	GLint,				64);
	LIMIT_CASE(max_transform_feedback_separate_attribs,			GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS,			GLint,				4);
	LIMIT_CASE(max_transform_feedback_separate_components,		GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS,		GLint,				4);
}